

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<double,_double,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<double,_double,_duckdb::LessThan> *this,ArenaAllocator *allocator,
          double *key,double *value)

{
  pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<double>_> *__first;
  double dVar1;
  bool bVar2;
  idx_t iVar3;
  ulong __holeIndex;
  STORAGE_TYPE *__first_00;
  HeapEntry<double> HVar4;
  HeapEntry<double> HVar5;
  pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<double>_> __value;
  pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<double>_> __value_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<double>_>_&)>
  __cmp;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<double>_>_&)>
  local_20;
  
  __first_00 = this->heap;
  __holeIndex = this->size;
  if (__holeIndex < this->capacity) {
    __first_00[__holeIndex].first.value = *key;
    __first_00[__holeIndex].second.value = *value;
    this->size = __holeIndex + 1;
    HVar4.value = __first_00[__holeIndex].first.value;
    HVar5.value = __first_00[__holeIndex].second.value;
  }
  else {
    bVar2 = duckdb::GreaterThan::Operation<double>((double *)__first_00,key);
    if (!bVar2) {
      return;
    }
    iVar3 = this->size;
    if (1 < (long)iVar3) {
      __first = this->heap;
      HVar4.value = __first[iVar3 - 1].first.value;
      HVar5.value = __first[iVar3 - 1].second.value;
      dVar1 = (__first->second).value;
      __first[iVar3 - 1].first.value = (__first->first).value;
      __first[iVar3 - 1].second.value = dVar1;
      __value.second.value = HVar5.value;
      __value.first.value = HVar4.value;
      std::
      __adjust_heap<std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<double>>*,long,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<double>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<double>>const&)>>
                (__first,0,(long)(iVar3 * 0x10 + -0x10) >> 4,__value,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<double>,_duckdb::HeapEntry<double>_>_&)>
                  )Compare);
      iVar3 = this->size;
    }
    __first_00 = this->heap;
    HVar4.value = *key;
    __first_00[iVar3 - 1].first.value = HVar4.value;
    HVar5.value = *value;
    __first_00[iVar3 - 1].second.value = HVar5.value;
    __holeIndex = ((long)(iVar3 * 0x10) >> 4) - 1;
  }
  local_20._M_comp = Compare;
  __value_00.second.value = HVar5.value;
  __value_00.first.value = HVar4.value;
  std::
  __push_heap<std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<double>>*,long,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<double>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<double>,duckdb::HeapEntry<double>>const&)>>
            (__first_00,__holeIndex,0,__value_00,&local_20);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}